

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O2

size_t apduRespEnc(octet *apdu,apdu_resp_t *resp)

{
  if (apdu != (octet *)0x0) {
    memCopy(apdu,resp + 1,resp->rdf_len);
    apdu[resp->rdf_len] = resp->sw1;
    apdu[resp->rdf_len + 1] = resp->sw2;
  }
  return resp->rdf_len + 2;
}

Assistant:

size_t apduRespEnc(octet apdu[], const apdu_resp_t* resp)
{
	// pre
	ASSERT(apduRespIsValid(resp));
	// кодировать
	if (apdu)
	{
		ASSERT(memIsValid(apdu, resp->rdf_len + 2));
		memCopy(apdu, resp->rdf, resp->rdf_len);
		apdu[resp->rdf_len] = resp->sw1, apdu[resp->rdf_len + 1] = resp->sw2;
	}
	// возвратить длину кода
	return resp->rdf_len + 2;
}